

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void vm_init(Vm *vm,_Bool interactive)

{
  uint32_t index;
  undefined1 local_50 [8];
  HashTable strings;
  CallFrame *call_frame;
  FrameArray frames;
  _Bool interactive_local;
  Vm *vm_local;
  
  vm->sp = vm->stack;
  vm->first_object = (Object *)0x0;
  vm->allocated_mem = 0;
  vm->max_alloc_mem = 0x100000;
  vm->frame_count = 0;
  vm->interactive = interactive;
  vm->err_flag = false;
  vm->current_status = VM_STATUS_INIT;
  frames.frame_pointers._7_1_ = interactive;
  frames_init((FrameArray *)&call_frame);
  *(CallFrame **)&vm->frames = call_frame;
  (vm->frames).frame_pointers = (CallFrame **)frames._0_8_;
  strings.buckets = (HTItem **)new_call_frame();
  index = vm->frame_count;
  vm->frame_count = index + 1;
  frames_write_at(&vm->frames,index,(CallFrame *)strings.buckets);
  ht_init((HashTable *)local_50,HT_KEY_IDENT_STRING,0x10,free_string_literal);
  (vm->strings).key_type = local_50._0_4_;
  (vm->strings).cap = local_50._4_4_;
  (vm->strings).size = strings.key_type;
  *(uint32_t *)&(vm->strings).field_0xc = strings.cap;
  (vm->strings).free_callback = (_func_void_HTItem_ptr *)strings._8_8_;
  (vm->strings).buckets = (HTItem **)strings.free_callback;
  return;
}

Assistant:

void vm_init(Vm *vm, bool interactive) {
    vm->sp = vm->stack;
    vm->first_object = NULL;
    vm->allocated_mem = 0;
    vm->max_alloc_mem = INITIAL_GC_THRESHOLD;
    vm->frame_count = 0;
    vm->interactive = interactive;
    vm->err_flag = false;
    vm->current_status = VM_STATUS_INIT;

    FrameArray frames;
    frames_init(&frames);
    vm->frames = frames;

    CallFrame *call_frame = new_call_frame();
    frames_write_at(&vm->frames, vm->frame_count++, call_frame);

    HashTable strings;
    ht_init(&strings, HT_KEY_IDENT_STRING, 16, free_string_literal);
    vm->strings = strings;
}